

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O3

int SimpleLoggerMgr::init(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  __base_type this;
  atomic<SimpleLoggerMgr_*> aVar2;
  
  aVar2._M_b._M_p = instance._M_b._M_p;
  if (instance._M_b._M_p == (__pointer_type)0x0) {
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&instanceLock);
    if (iVar1 != 0) {
      std::__throw_system_error(iVar1);
    }
    if (instance._M_b._M_p == (__pointer_type)0x0) {
      this._M_p = (__pointer_type)operator_new(0x450);
      SimpleLoggerMgr(this._M_p);
      instance._M_b._M_p = (__base_type)(__base_type)this._M_p;
    }
    aVar2._M_b._M_p = instance._M_b._M_p;
    pthread_mutex_unlock((pthread_mutex_t *)&instanceLock);
  }
  return SUB84(aVar2._M_b._M_p,0);
}

Assistant:

void SimpleLogger::setCriticalInfo(const std::string& info_str) {
    SimpleLoggerMgr* mgr = SimpleLoggerMgr::get();
    if (mgr) {
        mgr->setCriticalInfo(info_str);
    }
}